

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O2

int apply_robot_params(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int version;
  int age;
  
  yprintf(OUTPUT_LV_INFO,"Applying parameters.\n");
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    if (g_param.motor_enable[lVar3] != 0) {
      parameter_set('A',(char)lVar3,0x4b0);
    }
  }
  if (g_param_init != 0) {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      if (g_param.motor_enable[lVar3] != 0) {
        parameter_set('\0',(char)lVar3,0);
      }
    }
    g_param_init = 0;
  }
  if (9 < g_param.device_version) {
    __isoc99_sscanf("YPP:11:05","YPP:%d:%d",&version,&age);
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      if (g_param.motor_enable[lVar3] != 0) {
        parameter_set('d',(char)lVar3,(long)version);
      }
    }
  }
  iVar1 = set_param_motor();
  iVar2 = 0;
  if (iVar1 != 0) {
    yp_usleep(30000);
    iVar1 = set_param_velocity();
    if (iVar1 != 0) {
      yp_usleep(100000);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int apply_robot_params()
{
  yprintf(OUTPUT_LV_INFO, "Applying parameters.\n");

  int j;
  // ウォッチドックタイマの設定
  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    if (g_param.motor_enable[j])
      parameter_set(PARAM_watch_dog_limit, j, 1200);
  }

  if (g_param_init)
  {
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      if (g_param.motor_enable[j])
        parameter_set(PARAM_w_ref, j, 0);
    }
    g_param_init = 0;
  }

  if (g_param.device_version >= 10)
  {
    int version, age;
    sscanf(YP_PROTOCOL_NAME, "YPP:%d:%d", &version, &age);
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      if (g_param.motor_enable[j])
        parameter_set(PARAM_protocol_version, j, version);
    }
  }

  /* モータのパラメータ */
  if (set_param_motor() < 1)
    return 0;
  yp_usleep(30000);

  /* 速度制御パラメータ */
  if (set_param_velocity() < 1)
    return 0;
  yp_usleep(100000);

  return 1;
}